

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  long *plVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  uint uVar6;
  __m128i *palVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar13;
  __m128i *b_00;
  size_t len;
  ulong uVar14;
  __m128i *palVar15;
  ulong uVar16;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  long lVar17;
  ulong size;
  __m128i *ptr;
  uint uVar18;
  bool bVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i_64_t B_5;
  undefined1 auVar29 [16];
  __m128i_64_t B_1;
  undefined1 auVar30 [16];
  long lVar32;
  undefined1 auVar31 [16];
  __m128i_64_t B;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  __m128i_64_t B_2;
  longlong lVar42;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar58;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar59;
  undefined1 auVar57 [16];
  int iVar60;
  int iVar66;
  int iVar67;
  int iVar68;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  __m128i c;
  __m128i c_00;
  int32_t column_len;
  __m128i *local_b0;
  ulong uStack_50;
  ulong uStack_40;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_sse2_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_striped_profile_sse2_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_sse2_128_64_cold_6();
      }
      else {
        uVar18 = profile->s1Len;
        if ((int)uVar18 < 1) {
          parasail_sw_table_striped_profile_sse2_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_sse2_128_64_cold_4();
        }
        else {
          uVar16 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_sse2_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_sse2_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_sse2_128_64_cold_1();
          }
          else {
            uVar1 = (ulong)uVar18 + 1;
            iVar11 = ppVar4->max;
            result = parasail_result_new_table1((uint)uVar1 & 0x7ffffffe,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar1 >> 1;
              result->flag = result->flag | 0x2820804;
              b = parasail_memalign___m128i(0x10,size);
              palVar13 = parasail_memalign___m128i(0x10,size);
              local_b0 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              auVar27._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
              auVar27._4_4_ = -(uint)((int)palVar13 == 0 && (int)((ulong)palVar13 >> 0x20) == 0);
              auVar27._8_4_ = -(uint)((int)((ulong)local_b0 >> 0x20) == 0 && (int)local_b0 == 0);
              auVar27._12_4_ = -(uint)((int)b_00 == 0 && (int)((ulong)b_00 >> 0x20) == 0);
              iVar10 = movmskps((int)b_00,auVar27);
              if (iVar10 == 0) {
                len = 0x7fffffffffffffff;
                uVar26 = (ulong)(uint)gap;
                c[1] = extraout_RDX;
                c[0] = size;
                parasail_memset___m128i(b,c,0x7fffffffffffffff);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_00,c_00,len);
                auVar27 = _DAT_00904920;
                uStack_50 = (ulong)(uint)gap;
                uStack_40 = (ulong)(uint)open;
                uVar14 = 0;
                uVar6 = (uint)size;
                lVar17 = size * uVar16 * 4;
                lVar25 = -0x4000000000000000;
                lVar22 = 0;
                uVar21 = 0;
                auVar28 = _DAT_00904f60;
                auVar29 = _DAT_00904f60;
                do {
                  ptr = b;
                  iVar10 = ppVar4->mapper[(byte)s2[uVar21]];
                  iVar12 = (int)uVar14;
                  palVar15 = local_b0;
                  b = palVar13;
                  if (iVar12 == (int)uVar21 + -2) {
                    palVar15 = palVar13;
                    b = local_b0;
                  }
                  lVar42 = ptr[uVar6 - 1][0];
                  lVar23 = 0;
                  lVar20 = 0;
                  auVar30 = (undefined1  [16])0x0;
                  lVar24 = lVar22;
                  do {
                    plVar2 = (long *)((long)pvVar3 + lVar20 + (long)iVar10 * (long)(int)uVar6 * 0x10
                                     );
                    auVar53._0_8_ = lVar23 + *plVar2;
                    auVar53._8_8_ = lVar42 + plVar2[1];
                    auVar55 = *(undefined1 (*) [16])((long)*b_00 + lVar20);
                    auVar43 = auVar53 ^ auVar27;
                    auVar51 = auVar55 ^ auVar27;
                    iVar60 = -(uint)(auVar51._0_4_ < auVar43._0_4_);
                    iVar66 = -(uint)(auVar51._4_4_ < auVar43._4_4_);
                    iVar67 = -(uint)(auVar51._8_4_ < auVar43._8_4_);
                    iVar68 = -(uint)(auVar51._12_4_ < auVar43._12_4_);
                    auVar69._4_4_ = iVar60;
                    auVar69._0_4_ = iVar60;
                    auVar69._8_4_ = iVar67;
                    auVar69._12_4_ = iVar67;
                    iVar60 = -(uint)(auVar51._4_4_ == auVar43._4_4_);
                    iVar67 = -(uint)(auVar51._12_4_ == auVar43._12_4_);
                    auVar44._4_4_ = iVar60;
                    auVar44._0_4_ = iVar60;
                    auVar44._8_4_ = iVar67;
                    auVar44._12_4_ = iVar67;
                    auVar52._4_4_ = iVar66;
                    auVar52._0_4_ = iVar66;
                    auVar52._8_4_ = iVar68;
                    auVar52._12_4_ = iVar68;
                    auVar52 = auVar52 | auVar44 & auVar69;
                    auVar53 = ~auVar52 & auVar55 | auVar53 & auVar52;
                    auVar43 = auVar53 ^ auVar27;
                    auVar51 = auVar30 ^ auVar27;
                    iVar60 = -(uint)(auVar51._0_4_ < auVar43._0_4_);
                    iVar66 = -(uint)(auVar51._4_4_ < auVar43._4_4_);
                    iVar67 = -(uint)(auVar51._8_4_ < auVar43._8_4_);
                    iVar68 = -(uint)(auVar51._12_4_ < auVar43._12_4_);
                    auVar70._4_4_ = iVar60;
                    auVar70._0_4_ = iVar60;
                    auVar70._8_4_ = iVar67;
                    auVar70._12_4_ = iVar67;
                    iVar60 = -(uint)(auVar51._4_4_ == auVar43._4_4_);
                    iVar67 = -(uint)(auVar51._12_4_ == auVar43._12_4_);
                    auVar37._4_4_ = iVar60;
                    auVar37._0_4_ = iVar60;
                    auVar37._8_4_ = iVar67;
                    auVar37._12_4_ = iVar67;
                    auVar45._4_4_ = iVar66;
                    auVar45._0_4_ = iVar66;
                    auVar45._8_4_ = iVar68;
                    auVar45._12_4_ = iVar68;
                    auVar45 = auVar45 | auVar37 & auVar70;
                    auVar51 = ~auVar45 & auVar30 | auVar53 & auVar45;
                    auVar43 = auVar51 ^ auVar27;
                    iVar60 = -(uint)(auVar27._0_4_ < auVar43._0_4_);
                    iVar66 = -(uint)(auVar27._4_4_ < auVar43._4_4_);
                    iVar67 = -(uint)(auVar27._8_4_ < auVar43._8_4_);
                    iVar68 = -(uint)(auVar27._12_4_ < auVar43._12_4_);
                    auVar61._4_4_ = iVar60;
                    auVar61._0_4_ = iVar60;
                    auVar61._8_4_ = iVar67;
                    auVar61._12_4_ = iVar67;
                    iVar60 = -(uint)(auVar43._4_4_ == auVar27._4_4_);
                    iVar67 = -(uint)(auVar43._12_4_ == auVar27._12_4_);
                    auVar71._4_4_ = iVar60;
                    auVar71._0_4_ = iVar60;
                    auVar71._8_4_ = iVar67;
                    auVar71._12_4_ = iVar67;
                    auVar38._4_4_ = iVar66;
                    auVar38._0_4_ = iVar66;
                    auVar38._8_4_ = iVar68;
                    auVar38._12_4_ = iVar68;
                    auVar51 = (auVar38 | auVar71 & auVar61) & auVar51;
                    *(undefined1 (*) [16])((long)*b + lVar20) = auVar51;
                    piVar5 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar24) = auVar51._0_4_;
                    *(int *)((long)piVar5 + lVar17 + lVar24) = auVar51._8_4_;
                    auVar43 = auVar51 ^ auVar27;
                    auVar53 = auVar28 ^ auVar27;
                    iVar60 = -(uint)(auVar53._0_4_ < auVar43._0_4_);
                    iVar66 = -(uint)(auVar53._4_4_ < auVar43._4_4_);
                    iVar67 = -(uint)(auVar53._8_4_ < auVar43._8_4_);
                    iVar68 = -(uint)(auVar53._12_4_ < auVar43._12_4_);
                    auVar72._4_4_ = iVar60;
                    auVar72._0_4_ = iVar60;
                    auVar72._8_4_ = iVar67;
                    auVar72._12_4_ = iVar67;
                    iVar60 = -(uint)(auVar53._4_4_ == auVar43._4_4_);
                    iVar67 = -(uint)(auVar53._12_4_ == auVar43._12_4_);
                    auVar46._4_4_ = iVar60;
                    auVar46._0_4_ = iVar60;
                    auVar46._8_4_ = iVar67;
                    auVar46._12_4_ = iVar67;
                    auVar54._4_4_ = iVar66;
                    auVar54._0_4_ = iVar66;
                    auVar54._8_4_ = iVar68;
                    auVar54._12_4_ = iVar68;
                    auVar54 = auVar54 | auVar46 & auVar72;
                    auVar28 = ~auVar54 & auVar28 | auVar51 & auVar54;
                    auVar39._0_8_ = auVar51._0_8_ - (ulong)(uint)open;
                    auVar39._8_8_ = auVar51._8_8_ - uStack_40;
                    auVar51._0_8_ = auVar55._0_8_ - uVar26;
                    auVar51._8_8_ = auVar55._8_8_ - uStack_50;
                    auVar55 = auVar51 ^ auVar27;
                    auVar43 = auVar39 ^ auVar27;
                    iVar66 = -(uint)(auVar43._0_4_ < auVar55._0_4_);
                    iVar60 = auVar43._4_4_;
                    auVar62._4_4_ = -(uint)(iVar60 < auVar55._4_4_);
                    iVar68 = -(uint)(auVar43._8_4_ < auVar55._8_4_);
                    iVar67 = auVar43._12_4_;
                    auVar62._12_4_ = -(uint)(iVar67 < auVar55._12_4_);
                    auVar73._4_4_ = iVar66;
                    auVar73._0_4_ = iVar66;
                    auVar73._8_4_ = iVar68;
                    auVar73._12_4_ = iVar68;
                    auVar56._4_4_ = -(uint)(auVar55._4_4_ == iVar60);
                    auVar56._12_4_ = -(uint)(auVar55._12_4_ == iVar67);
                    auVar56._0_4_ = auVar56._4_4_;
                    auVar56._8_4_ = auVar56._12_4_;
                    auVar62._0_4_ = auVar62._4_4_;
                    auVar62._8_4_ = auVar62._12_4_;
                    auVar62 = auVar62 | auVar56 & auVar73;
                    *(undefined1 (*) [16])((long)*b_00 + lVar20) =
                         ~auVar62 & auVar39 | auVar51 & auVar62;
                    auVar55._0_8_ = auVar30._0_8_ - uVar26;
                    auVar55._8_8_ = auVar30._8_8_ - uStack_50;
                    auVar30 = auVar55 ^ auVar27;
                    iVar66 = -(uint)(auVar43._0_4_ < auVar30._0_4_);
                    iVar68 = -(uint)(iVar60 < auVar30._4_4_);
                    iVar58 = -(uint)(auVar43._8_4_ < auVar30._8_4_);
                    iVar59 = -(uint)(iVar67 < auVar30._12_4_);
                    auVar63._4_4_ = iVar66;
                    auVar63._0_4_ = iVar66;
                    auVar63._8_4_ = iVar58;
                    auVar63._12_4_ = iVar58;
                    auVar43._4_4_ = -(uint)(auVar30._4_4_ == iVar60);
                    auVar43._12_4_ = -(uint)(auVar30._12_4_ == iVar67);
                    auVar43._0_4_ = auVar43._4_4_;
                    auVar43._8_4_ = auVar43._12_4_;
                    auVar47._4_4_ = iVar68;
                    auVar47._0_4_ = iVar68;
                    auVar47._8_4_ = iVar59;
                    auVar47._12_4_ = iVar59;
                    auVar47 = auVar47 | auVar43 & auVar63;
                    auVar30 = ~auVar47 & auVar39 | auVar55 & auVar47;
                    plVar2 = (long *)((long)*ptr + lVar20);
                    lVar23 = *plVar2;
                    lVar42 = plVar2[1];
                    lVar20 = lVar20 + 0x10;
                    lVar24 = lVar24 + uVar16 * 4;
                  } while (size << 4 != lVar20);
                  bVar9 = true;
                  do {
                    bVar19 = bVar9;
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = auVar30._0_8_;
                    auVar30 = auVar8 << 0x40;
                    lVar24 = 0;
                    lVar23 = lVar22;
                    do {
                      auVar55 = *(undefined1 (*) [16])((long)*b + lVar24);
                      auVar43 = auVar30 ^ auVar27;
                      auVar51 = auVar55 ^ auVar27;
                      iVar10 = -(uint)(auVar43._0_4_ < auVar51._0_4_);
                      iVar60 = -(uint)(auVar43._4_4_ < auVar51._4_4_);
                      iVar67 = -(uint)(auVar43._8_4_ < auVar51._8_4_);
                      iVar66 = -(uint)(auVar43._12_4_ < auVar51._12_4_);
                      auVar64._4_4_ = iVar10;
                      auVar64._0_4_ = iVar10;
                      auVar64._8_4_ = iVar67;
                      auVar64._12_4_ = iVar67;
                      auVar48._4_4_ = -(uint)(auVar51._4_4_ == auVar43._4_4_);
                      auVar48._12_4_ = -(uint)(auVar51._12_4_ == auVar43._12_4_);
                      auVar48._0_4_ = auVar48._4_4_;
                      auVar48._8_4_ = auVar48._12_4_;
                      auVar33._4_4_ = iVar60;
                      auVar33._0_4_ = iVar60;
                      auVar33._8_4_ = iVar66;
                      auVar33._12_4_ = iVar66;
                      auVar33 = auVar33 | auVar48 & auVar64;
                      auVar55 = ~auVar33 & auVar30 | auVar55 & auVar33;
                      *(undefined1 (*) [16])((long)*b + lVar24) = auVar55;
                      piVar5 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar5 + lVar23) = auVar55._0_4_;
                      lVar20 = (long)piVar5 + lVar23;
                      *(int *)(lVar17 + lVar20) = auVar55._8_4_;
                      auVar43 = auVar55 ^ auVar27;
                      auVar51 = auVar28 ^ auVar27;
                      iVar10 = -(uint)(auVar51._0_4_ < auVar43._0_4_);
                      iVar67 = -(uint)(auVar51._4_4_ < auVar43._4_4_);
                      iVar60 = -(uint)(auVar51._8_4_ < auVar43._8_4_);
                      iVar66 = -(uint)(auVar51._12_4_ < auVar43._12_4_);
                      auVar65._4_4_ = iVar10;
                      auVar65._0_4_ = iVar10;
                      auVar65._8_4_ = iVar60;
                      auVar65._12_4_ = iVar60;
                      iVar10 = -(uint)(auVar51._4_4_ == auVar43._4_4_);
                      iVar60 = -(uint)(auVar51._12_4_ == auVar43._12_4_);
                      auVar40._4_4_ = iVar10;
                      auVar40._0_4_ = iVar10;
                      auVar40._8_4_ = iVar60;
                      auVar40._12_4_ = iVar60;
                      auVar49._4_4_ = iVar67;
                      auVar49._0_4_ = iVar67;
                      auVar49._8_4_ = iVar66;
                      auVar49._12_4_ = iVar66;
                      auVar49 = auVar49 | auVar40 & auVar65;
                      auVar28 = ~auVar49 & auVar28 | auVar55 & auVar49;
                      auVar34._0_8_ = auVar55._0_8_ - (ulong)(uint)open;
                      auVar34._8_8_ = auVar55._8_8_ - uStack_40;
                      lVar32 = auVar30._8_8_;
                      auVar30._0_8_ = auVar30._0_8_ - uVar26;
                      auVar30._8_8_ = lVar32 - uStack_50;
                      auVar34 = auVar34 ^ auVar27;
                      auVar55 = auVar30 ^ auVar27;
                      iVar10 = -(uint)(auVar34._0_4_ < auVar55._0_4_);
                      iVar67 = -(uint)(auVar34._4_4_ < auVar55._4_4_);
                      iVar60 = -(uint)(auVar34._8_4_ < auVar55._8_4_);
                      iVar66 = -(uint)(auVar34._12_4_ < auVar55._12_4_);
                      auVar57._4_4_ = iVar10;
                      auVar57._0_4_ = iVar10;
                      auVar57._8_4_ = iVar60;
                      auVar57._12_4_ = iVar60;
                      iVar10 = -(uint)(auVar55._4_4_ == auVar34._4_4_);
                      iVar60 = -(uint)(auVar55._12_4_ == auVar34._12_4_);
                      auVar35._4_4_ = iVar10;
                      auVar35._0_4_ = iVar10;
                      auVar35._8_4_ = iVar60;
                      auVar35._12_4_ = iVar60;
                      auVar41._4_4_ = iVar67;
                      auVar41._0_4_ = iVar67;
                      auVar41._8_4_ = iVar66;
                      auVar41._12_4_ = iVar66;
                      iVar10 = movmskps((int)lVar20,auVar41 | auVar35 & auVar57);
                      if (iVar10 == 0) goto LAB_005c1976;
                      lVar24 = lVar24 + 0x10;
                      lVar23 = lVar23 + uVar16 * 4;
                    } while (size << 4 != lVar24);
                    bVar9 = false;
                  } while (bVar19);
LAB_005c1976:
                  auVar30 = auVar29 ^ auVar27;
                  auVar55 = auVar28 ^ auVar27;
                  iVar60 = -(uint)(auVar30._0_4_ < auVar55._0_4_);
                  iVar66 = -(uint)(auVar30._4_4_ < auVar55._4_4_);
                  iVar67 = -(uint)(auVar30._8_4_ < auVar55._8_4_);
                  iVar68 = -(uint)(auVar30._12_4_ < auVar55._12_4_);
                  auVar50._4_4_ = iVar60;
                  auVar50._0_4_ = iVar60;
                  auVar50._8_4_ = iVar67;
                  auVar50._12_4_ = iVar67;
                  iVar60 = -(uint)(auVar55._4_4_ == auVar30._4_4_);
                  iVar67 = -(uint)(auVar55._12_4_ == auVar30._12_4_);
                  auVar31._4_4_ = iVar60;
                  auVar31._0_4_ = iVar60;
                  auVar31._8_4_ = iVar67;
                  auVar31._12_4_ = iVar67;
                  auVar36._4_4_ = iVar66;
                  auVar36._0_4_ = iVar66;
                  auVar36._8_4_ = iVar68;
                  auVar36._12_4_ = iVar68;
                  iVar10 = movmskps(iVar10,auVar36 | auVar31 & auVar50);
                  if (iVar10 != 0) {
                    lVar25 = auVar28._8_8_;
                    if (auVar28._8_8_ < auVar28._0_8_) {
                      lVar25 = auVar28._0_8_;
                    }
                    if ((long)(~(long)iVar11 + 0x7fffffffffffffffU) < lVar25) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      s2Len = (int)uVar21;
                      goto LAB_005c1a0f;
                    }
                    auVar29._8_4_ = (int)lVar25;
                    auVar29._0_8_ = lVar25;
                    auVar29._12_4_ = (int)((ulong)lVar25 >> 0x20);
                    uVar14 = uVar21 & 0xffffffff;
                  }
                  iVar12 = (int)uVar14;
                  uVar21 = uVar21 + 1;
                  lVar22 = lVar22 + 4;
                  palVar13 = ptr;
                  local_b0 = palVar15;
                  if (uVar21 == uVar16) {
LAB_005c1a0f:
                    if (lVar25 == 0x7fffffffffffffff) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar11 = parasail_result_is_saturated(result);
                    palVar13 = palVar15;
                    if (iVar11 == 0) {
                      palVar7 = ptr;
                      if (iVar12 == s2Len + -2) {
                        palVar13 = ptr;
                        palVar7 = palVar15;
                      }
                      if (iVar12 == s2Len + -1) {
                        palVar13 = b;
                        b = palVar15;
                        palVar7 = ptr;
                      }
                      ptr = palVar7;
                      iVar11 = uVar18 - 1;
                      if ((uVar1 & 0x7ffffffe) != 0) {
                        uVar16 = 0;
                        do {
                          if ((*palVar13)[uVar16] == lVar25) {
                            uVar18 = 0;
                            if ((uVar16 & 1) != 0) {
                              uVar18 = uVar6;
                            }
                            iVar10 = uVar18 + ((uint)(uVar16 >> 1) & 0x7fffffff);
                            if (iVar10 < iVar11) {
                              iVar11 = iVar10;
                            }
                          }
                          uVar16 = uVar16 + 1;
                        } while ((uVar6 & 0x3fffffff) * 2 != (int)uVar16);
                      }
                    }
                    else {
                      iVar12 = 0;
                      lVar25 = 0xffffffff;
                      iVar11 = 0;
                    }
                    result->score = (int)lVar25;
                    result->end_query = iVar11;
                    result->end_ref = iVar12;
                    parasail_free(b_00);
                    parasail_free(palVar13);
                    parasail_free(ptr);
                    parasail_free(b);
                    return result;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int64_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            vH = _mm_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}